

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall
testing::TestEventListeners::SetDefaultResultPrinter
          (TestEventListeners *this,TestEventListener *listener)

{
  TestEventListeners *this_00;
  long in_RSI;
  long in_RDI;
  TestEventListener *in_stack_ffffffffffffffd8;
  TestEventListeners *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 8) != in_RSI) {
    this_00 = (TestEventListeners *)Release(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (this_00 != (TestEventListeners *)0x0) {
      (**(code **)&this_00->repeater_->forwarding_enabled_)();
    }
    *(long *)(in_RDI + 8) = in_RSI;
    if (in_RSI != 0) {
      Append(this_00,in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void TestEventListeners::SetDefaultResultPrinter(TestEventListener* listener) {
  if (default_result_printer_ != listener) {
    // It is an error to pass this method a listener that is already in the
    // list.
    delete Release(default_result_printer_);
    default_result_printer_ = listener;
    if (listener != NULL)
      Append(listener);
  }
}